

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_queue.cpp
# Opt level: O0

void __thiscall sc_core::sc_event_queue::cancel_all(sc_event_queue *this)

{
  int iVar1;
  sc_time *psVar2;
  sc_event *in_RDI;
  
  *(undefined4 *)
   &in_RDI[2].m_methods_dynamic.
    super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  while (iVar1 = sc_ppq_base::size((sc_ppq_base *)&in_RDI[1].m_methods_static), 0 < iVar1) {
    psVar2 = sc_ppq<sc_core::sc_time_*>::extract_top((sc_ppq<sc_core::sc_time_*> *)0x223194);
    if (psVar2 != (sc_time *)0x0) {
      operator_delete(psVar2);
    }
  }
  sc_event::cancel(in_RDI);
  return;
}

Assistant:

void sc_event_queue::cancel_all()
{
    m_pending_delta = 0;
    while( m_ppq.size() > 0 )
	delete m_ppq.extract_top();
    m_e.cancel();
}